

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O3

optional<PSEngine::TurnHistory> * __thiscall
PSEngine::tick(optional<PSEngine::TurnHistory> *__return_storage_ptr__,PSEngine *this,
              float p_delta_time)

{
  float fVar1;
  element_type *peVar2;
  byte bVar3;
  float fVar4;
  Operation op;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  undefined1 local_58 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  bVar3 = (this->m_compiled_game).prelude_info.realtime_interval.
          super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>.
          _M_engaged;
  if ((bool)bVar3 == false) {
    if ((int)(this->m_config).log_verbosity < 5) {
      peVar2 = (this->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
                 m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
                 m_engine_log_cat_abi_cxx11_._M_string_length);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_98,
                 "Trying to tick the engine but the loaded puzzlescript doesn\'t have realtime setup."
                 ,"");
      (*peVar2->_vptr_PSLogger[2])(peVar2,4,local_78,local_98);
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if ((this->m_config).log_operation_history_after_error == true) {
        print_operation_history(this);
      }
    }
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
  }
  else {
    if ((this->m_config).add_ticks_to_operation_history == true) {
      local_b8 = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"");
      local_58._0_4_ = Undo;
      local_58._4_4_ = None;
      local_58._8_4_ = -1;
      local_58._12_4_ = -1.0;
      local_58._16_8_ = &local_38;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_58 + 0x10),local_b8,local_b0 + (long)local_b8);
      if (local_b8 != local_a8) {
        operator_delete(local_b8,local_a8[0] + 1);
      }
      local_58._12_4_ = p_delta_time;
      std::vector<PSEngine::Operation,_std::allocator<PSEngine::Operation>_>::push_back
                (&this->m_operation_history,(value_type *)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._16_8_ != &local_38) {
        operator_delete((void *)local_58._16_8_,
                        CONCAT71(local_38._M_allocated_capacity._1_7_,local_38._M_local_buf[0]) + 1)
        ;
      }
      bVar3 = (this->m_compiled_game).prelude_info.realtime_interval.
              super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>
              ._M_engaged;
    }
    if ((bVar3 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    fVar1 = (this->m_compiled_game).prelude_info.realtime_interval.
            super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float>.
            _M_payload._M_value;
    fVar4 = p_delta_time + this->m_current_tick_time_elapsed;
    this->m_current_tick_time_elapsed = fVar4;
    (__return_storage_ptr__->super__Optional_base<PSEngine::TurnHistory,_false,_false>)._M_payload.
    super__Optional_payload<PSEngine::TurnHistory,_true,_false,_false>.
    super__Optional_payload_base<PSEngine::TurnHistory>._M_engaged = false;
    if (fVar1 <= fVar4) {
      do {
        this->m_current_tick_time_elapsed = fVar4 - fVar1;
        next_turn((optional<PSEngine::TurnHistory> *)local_58,this);
        std::_Optional_payload_base<PSEngine::TurnHistory>::_M_move_assign
                  ((_Optional_payload_base<PSEngine::TurnHistory> *)__return_storage_ptr__,
                   (_Optional_payload_base<PSEngine::TurnHistory> *)local_58);
        if (local_38._M_local_buf[0] == '\x01') {
          local_38._M_local_buf[0] = '\0';
          std::vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>::~vector
                    ((vector<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_> *)
                     local_58);
        }
        fVar4 = this->m_current_tick_time_elapsed;
      } while (fVar1 <= fVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

optional<PSEngine::TurnHistory> PSEngine::tick(float p_delta_time)
{
    if(!m_compiled_game.prelude_info.realtime_interval.has_value())
    {
        PS_LOG_ERROR("Trying to tick the engine but the loaded puzzlescript doesn't have realtime setup.");
        return nullopt;
    }

    if(m_config.add_ticks_to_operation_history)
    {
        Operation op = Operation(OperationType::Undo);
        op.delta_time = p_delta_time;
        m_operation_history.push_back(op);
    }


    float realtime_interval = m_compiled_game.prelude_info.realtime_interval.value();

    m_current_tick_time_elapsed += p_delta_time;

    optional<TurnHistory> result = nullopt;

    while(m_current_tick_time_elapsed >= realtime_interval)
    {
        m_current_tick_time_elapsed -= realtime_interval;
        result = next_turn();
    }

    return result; //todo ? only yhe last one will be return if several turns happened during the same tick
}